

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O2

void si9ma::Trie::delete_str(TrieNode *root,string *str)

{
  TrieNode *pTVar1;
  int iVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  iVar2 = search(root,str);
  if (0 < iVar2) {
    root->pass = root->pass + -1;
    for (uVar4 = 0; uVar4 < str->_M_string_length; uVar4 = uVar4 + 1) {
      lVar3 = (long)(str->_M_dataplus)._M_p[uVar4];
      pTVar1 = *(TrieNode **)((long)root + lVar3 * 8 + -0x300);
      pTVar1->pass = pTVar1->pass + -1;
      if (pTVar1->pass == 0) {
        *(undefined8 *)((long)root + lVar3 * 8 + -0x300) = 0;
      }
      if (root->pass == 0) {
        TrieNode::~TrieNode(root);
        operator_delete(root);
      }
      root = pTVar1;
    }
    root->end = root->end + -1;
    if (root->pass == 0) {
      TrieNode::~TrieNode(root);
      operator_delete(root);
      return;
    }
  }
  return;
}

Assistant:

void Trie::delete_str(TrieNode *root,const string &str) {
        if (search(root,str) > 0) {
            root->pass--;
            auto *cur = root;
            auto *next = root;

            for (int i = 0; i < str.length(); ++i) {
                int index = str[i] - 'a';

                next = cur->nexts[index];

                // if next pass == 0,reset cur next ptr to null
                if (--cur->nexts[index]->pass == 0)
                    cur->nexts[index] = nullptr;

                // delete cur,if pass == 0
                if (cur->pass == 0)
                    delete cur;

                cur = next;
            }

            cur->end--;

            // delete last is pass == null
            if (cur->pass == 0)
                delete cur;
        }
    }